

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataGroup.cpp
# Opt level: O0

bool __thiscall DL::DataGroup::isAllNamedNumber(DataGroup *this)

{
  bool bVar1;
  element_type *peVar2;
  reference this_00;
  Data *d;
  iterator __end1;
  iterator __begin1;
  vector_t<Data> *__range1;
  DataGroup *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (!bVar1) {
    __assert_fail("(mShared)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/DataGroup.cpp"
                  ,0xd3,"bool DL::DataGroup::isAllNamedNumber() const");
  }
  peVar2 = std::__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar1 = std::vector<DL::Data,_std::allocator<DL::Data>_>::empty(&peVar2->NamedData);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    peVar2 = std::__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    __end1 = std::vector<DL::Data,_std::allocator<DL::Data>_>::begin(&peVar2->NamedData);
    d = (Data *)std::vector<DL::Data,_std::allocator<DL::Data>_>::end(&peVar2->NamedData);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                                       *)&d), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>::
                operator*(&__end1);
      bVar1 = Data::isNumber(this_00);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::__normal_iterator<DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>::
      operator++(&__end1);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DataGroup::isAllNamedNumber() const
{
	DL_ASSERT(mShared);

	if (mShared->NamedData.empty())
		return false;

	for (const Data& d : mShared->NamedData) {
		if (!d.isNumber())
			return false;
	}

	return true;
}